

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  __m128i ww [2];
  longlong local_a8 [8];
  __m128i pixels [3];
  undefined1 auVar3 [16];
  
  uVar1 = *(uint *)above;
  pixels[1] = *(__m128i *)left;
  auVar4 = pshuflw(ZEXT416(uVar1 >> 0x18),ZEXT416(uVar1 >> 0x18),0);
  pixels[2][0]._0_4_ = auVar4._0_4_;
  auVar4 = (undefined1  [16])pixels[1] >> 0x78 & (undefined1  [16])0xff;
  auVar4 = pshuflw(auVar4,auVar4,0);
  pixels[0][0]._0_2_ = (ushort)(byte)uVar1;
  auVar3._0_12_ = ZEXT712(0);
  auVar3[0xc] = (char)(uVar1 >> 0x18);
  auVar3[0xd] = 0;
  auVar3._14_2_ = auVar4._6_2_;
  auVar2._12_4_ = auVar3._12_4_;
  auVar2._0_10_ = (unkuint10)0;
  auVar2._10_2_ = auVar4._4_2_;
  pixels[0][1]._2_6_ = auVar2._10_6_;
  pixels[0][1]._0_2_ = (ushort)(byte)(uVar1 >> 0x10);
  pixels[0][0]._6_2_ = auVar4._2_2_;
  pixels[0][0]._4_2_ = (ushort)(byte)(uVar1 >> 8);
  pixels[0][0]._2_2_ = auVar4._0_2_;
  ww[0][0] = 0x6b0095000100ff;
  ww[0][1] = 0xc0004000ab0055;
  local_a8[0] = 0xaa00c400e100ff;
  local_a8[1] = 0x540066007b0091;
  local_a8[2] = 0x56003c001f0001;
  local_a8[3] = 0xac009a0085006f;
  local_a8[4] = 0x21002b00360044;
  local_a8[5] = 0x1000110014001a;
  local_a8[6] = 0xdf00d500ca00bc;
  local_a8[7] = 0xf000ef00ec00e6;
  pixels[2][0]._4_4_ = (undefined4)pixels[2][0];
  pixels[2][1]._0_4_ = (undefined4)pixels[2][0];
  pixels[2][1]._4_4_ = (undefined4)pixels[2][0];
  smooth_pred_4xh(pixels,(__m128i *)local_a8,ww,8,dst,stride,0);
  smooth_pred_4xh(pixels,(__m128i *)(local_a8 + 4),ww,8,dst + stride * 8,stride,1);
  return;
}

Assistant:

void aom_smooth_predictor_4x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i pixels[3];
  load_pixel_w4(above, left, 16, pixels);

  __m128i wh[4], ww[2];
  load_weight_w4(16, wh, ww);

  smooth_pred_4xh(pixels, wh, ww, 8, dst, stride, 0);
  dst += stride << 3;
  smooth_pred_4xh(pixels, &wh[2], ww, 8, dst, stride, 1);
}